

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

RK_S32 mpp_av1_superres_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_S32 RVar1;
  undefined8 in_RAX;
  uint uVar2;
  RK_U32 value_1;
  RK_U32 value;
  undefined8 local_28;
  
  local_28 = in_RAX;
  if (ctx->sequence_header->enable_superres == '\0') {
    current->use_superres = '\0';
  }
  else {
    RVar1 = mpp_av1_read_unsigned(gb,1,"use_superres",(RK_U32 *)((long)&local_28 + 4),0,1);
    if (RVar1 < 0) {
      return RVar1;
    }
    current->use_superres = local_28._4_1_;
  }
  if (current->use_superres == '\0') {
    uVar2 = 8;
  }
  else {
    RVar1 = mpp_av1_read_unsigned(gb,3,"coded_denom",(RK_U32 *)&local_28,0,7);
    if (RVar1 < 0) {
      return -1;
    }
    current->coded_denom = (RK_U8)local_28;
    uVar2 = current->coded_denom + 9;
  }
  ctx->upscaled_width = ctx->frame_width;
  ctx->frame_width = (int)((uVar2 >> 1) + ctx->frame_width * 8) / (int)uVar2;
  return 0;
}

Assistant:

static RK_S32 mpp_av1_superres_params(AV1Context *ctx, BitReadCtx_t *gb,
                                      AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 denom, err;

    if (seq->enable_superres)
        flag(use_superres);
    else
        infer(use_superres, 0);

    if (current->use_superres) {
        fb(3, coded_denom);
        denom = current->coded_denom + AV1_SUPERRES_DENOM_MIN;
    } else {
        denom = AV1_SUPERRES_NUM;
    }

    ctx->upscaled_width = ctx->frame_width;
    ctx->frame_width = (ctx->upscaled_width * AV1_SUPERRES_NUM +
                        denom / 2) / denom;
    return 0;
}